

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

double anon_unknown.dwarf_46bbf7::standard_deviation(iterator first,iterator last)

{
  difference_type dVar1;
  anon_class_8_1_54a3980d __binary_op;
  double dVar2;
  double variance;
  double m;
  iterator last_local;
  iterator first_local;
  
  m = (double)last._M_current;
  last_local = first;
  __binary_op.m =
       Catch::Benchmark::Detail::
       mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                 ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                  first._M_current,
                  (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                  last._M_current);
  dVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,(anonymous_namespace)::standard_deviation(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)::__0>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     last_local._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)m,
                     0.0,__binary_op);
  dVar1 = __gnu_cxx::operator-
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     &m,&last_local);
  dVar2 = sqrt(dVar2 / (double)dVar1);
  return dVar2;
}

Assistant:

double standard_deviation(std::vector<double>::iterator first, std::vector<double>::iterator last) {
        auto m = Catch::Benchmark::Detail::mean(first, last);
        double variance = std::accumulate(first, last, 0., [m](double a, double b) {
            double diff = b - m;
            return a + diff * diff;
            }) / (last - first);
            return std::sqrt(variance);
    }